

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_ellipse.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_Ellipse::DerivativeAt(ON_3dVector *__return_storage_ptr__,ON_Ellipse *this,int d,double t)

{
  int iVar1;
  double dVar2;
  ON_3dVector local_60;
  ON_3dVector local_48;
  double local_30;
  double r1;
  double r0;
  double t_local;
  ON_Ellipse *pOStack_10;
  int d_local;
  ON_Ellipse *this_local;
  
  r1 = this->radius[0];
  local_30 = this->radius[1];
  iVar1 = d;
  if (d < 1) {
    iVar1 = -d;
  }
  r0 = t;
  t_local._4_4_ = d;
  pOStack_10 = this;
  switch(iVar1 % 4) {
  case 0:
    dVar2 = cos(t);
    r1 = dVar2 * r1;
    dVar2 = sin(r0);
    local_30 = dVar2 * local_30;
    break;
  case 1:
    dVar2 = sin(t);
    r1 = -dVar2 * r1;
    dVar2 = cos(r0);
    local_30 = dVar2 * local_30;
    break;
  case 2:
    dVar2 = cos(t);
    r1 = -dVar2 * r1;
    dVar2 = sin(r0);
    local_30 = -dVar2 * local_30;
    break;
  case 3:
    dVar2 = sin(t);
    r1 = dVar2 * r1;
    dVar2 = cos(r0);
    local_30 = -dVar2 * local_30;
  }
  ::operator*(&local_48,r1,&(this->plane).xaxis);
  ::operator*(&local_60,local_30,&(this->plane).yaxis);
  ON_3dVector::operator+(__return_storage_ptr__,&local_48,&local_60);
  return __return_storage_ptr__;
}

Assistant:

ON_3dVector ON_Ellipse::DerivativeAt( 
                 int d, // desired derivative ( >= 0 )
                 double t // parameter
                 ) const
{
  double r0 = radius[0];
  double r1 = radius[1];
  switch ( std::abs(d) % 4 )
  {
  case 0:
    r0 *=  cos(t);
    r1 *=  sin(t);
    break;
  case 1:
    r0 *= -sin(t);
    r1 *=  cos(t);
    break;
  case 2:
    r0 *= -cos(t);
    r1 *= -sin(t);
    break;
  case 3:
    r0 *=  sin(t);
    r1 *= -cos(t);
    break;
  }
  return ( r0*plane.xaxis + r1*plane.yaxis );
}